

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mutex_stats_emit(emitter_t *emitter,emitter_row_t *row,emitter_col_t *col_uint64_t,
                     emitter_col_t *col_uint32_t)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  emitter_t *in_RCX;
  long in_RDX;
  long in_RSI;
  emitter_col_t *col;
  mutex_prof_uint32_t_counter_ind_t k_uint32_t;
  mutex_prof_uint64_t_counter_ind_t k_uint64_t;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffdc;
  
  if (in_RSI != 0) {
    emitter_table_row(in_RCX,(emitter_row_t *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  uVar4 = 0;
  uVar1 = 1;
  emitter_json_kv(in_RCX,(char *)0x100000000,(emitter_type_t)((ulong)in_RDX >> 0x20),
                  in_stack_ffffffffffffffc8);
  uVar2 = uVar1 + 1;
  emitter_json_kv(in_RCX,(char *)CONCAT44(uVar2,uVar4),
                  (emitter_type_t)(in_RDX + (ulong)uVar1 * 0x28 >> 0x20),in_stack_ffffffffffffffc8);
  uVar1 = uVar2 + 1;
  emitter_json_kv(in_RCX,(char *)CONCAT44(uVar1,uVar4),
                  (emitter_type_t)(in_RDX + (ulong)uVar2 * 0x28 >> 0x20),in_stack_ffffffffffffffc8);
  uVar2 = uVar1 + 1;
  emitter_json_kv(in_RCX,(char *)CONCAT44(uVar2,uVar4),
                  (emitter_type_t)(in_RDX + (ulong)uVar1 * 0x28 >> 0x20),in_stack_ffffffffffffffc8);
  uVar1 = uVar2 + 1;
  emitter_json_kv(in_RCX,(char *)CONCAT44(uVar1,uVar4),
                  (emitter_type_t)(in_RDX + (ulong)uVar2 * 0x28 >> 0x20),in_stack_ffffffffffffffc8);
  iVar3 = uVar1 + 1;
  emitter_json_kv(in_RCX,(char *)CONCAT44(iVar3,uVar4),
                  (emitter_type_t)(in_RDX + (ulong)uVar1 * 0x28 >> 0x20),in_stack_ffffffffffffffc8);
  emitter_json_kv(in_RCX,(char *)CONCAT44(iVar3,uVar4 + 1),
                  (emitter_type_t)((long)in_RCX + (ulong)uVar4 * 0x28 >> 0x20),
                  in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void
mutex_stats_emit(emitter_t *emitter, emitter_row_t *row,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters]) {
	if (row != NULL) {
		emitter_table_row(emitter, row);
	}

	mutex_prof_uint64_t_counter_ind_t k_uint64_t = 0;
	mutex_prof_uint32_t_counter_ind_t k_uint32_t = 0;

	emitter_col_t *col;

#define EMITTER_TYPE_uint32_t emitter_type_uint32
#define EMITTER_TYPE_uint64_t emitter_type_uint64
#define OP(counter, type, human, derived, base_counter)		\
	if (!derived) {                    \
		col = &col_##type[k_##type];                        \
		++k_##type;                            \
		emitter_json_kv(emitter, #counter, EMITTER_TYPE_##type,        \
		    (const void *)&col->bool_val); \
	}
	MUTEX_PROF_COUNTERS;
#undef OP
#undef EMITTER_TYPE_uint32_t
#undef EMITTER_TYPE_uint64_t
}